

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

string * __thiscall
deqp::gls::probabilityStr_abi_cxx11_(string *__return_storage_ptr__,gls *this,float prob)

{
  long lVar1;
  char *pcVar2;
  string *extraout_RAX;
  long *plVar3;
  string *extraout_RAX_00;
  string *psVar4;
  size_type *psVar5;
  int in_EDX;
  char *pcVar6;
  string local_30;
  
  if ((prob != 0.0) || (NAN(prob))) {
    if ((prob != 1.0) || (NAN(prob))) {
      de::floatToString_abi_cxx11_(&local_30,(de *)0x0,prob * 100.0,in_EDX);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_30);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar5) {
        lVar1 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      psVar4 = (string *)&local_30.field_2;
      if ((string *)local_30._M_dataplus._M_p != psVar4) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        psVar4 = extraout_RAX_00;
      }
      return psVar4;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "ALWAYS";
    pcVar2 = "GL_ALWAYS";
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = "never";
    pcVar2 = "cmp_never";
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar6,pcVar2 + 9);
  return extraout_RAX;
}

Assistant:

static inline string probabilityStr (const float prob)
{
	return prob == 0.0f ? "never"	:
		   prob == 1.0f ? "ALWAYS"	:
		   de::floatToString(prob*100.0f, 0) + "%";
}